

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::NurbsSurfaceGeometry<2L>_> __thiscall
anurbs::Model::get_lazy<anurbs::NurbsSurfaceGeometry<2l>>(Model *this,string *key)

{
  bool bVar1;
  mapped_type *this_00;
  pointer ppVar2;
  type *ptVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_> RVar4;
  shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> local_d8;
  shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> local_c8;
  int local_b4;
  pair<unsigned_long,_unsigned_long> local_b0;
  shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> local_a0;
  shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> local_90;
  string local_80;
  undefined1 local_60 [16];
  size_type index;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_38;
  iterator it;
  Pointer<Entry<NurbsSurfaceGeometry<2L>_>_> entry;
  string *key_local;
  Model *this_local;
  
  std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::shared_ptr
            ((shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> *)&it);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               *)&key[1].field_2,in_RDX);
  index = (size_type)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)&key[1].field_2);
  bVar1 = std::__detail::operator==
                    (&stack0xffffffffffffffc8,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                      *)&index);
  if (bVar1) {
    local_60._8_8_ =
         std::
         vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
         ::size((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                 *)key);
    std::__cxx11::string::string((string *)&local_80,(string *)in_RDX);
    std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::shared_ptr(&local_90,(nullptr_t)0x0);
    Entry<anurbs::NurbsSurfaceGeometry<2L>_>::create
              ((Entry<anurbs::NurbsSurfaceGeometry<2L>_> *)local_60,&local_80,&local_90);
    std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>>::operator=
              ((shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>> *)&it,
               (unique_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
                *)local_60);
    std::
    unique_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
    ::~unique_ptr((unique_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
                   *)local_60);
    std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr(&local_90);
    std::__cxx11::string::~string((string *)&local_80);
    std::static_pointer_cast<anurbs::EntryBase,anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>>
              (&local_a0);
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::push_back((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                 *)key,(value_type *)&local_a0);
    std::shared_ptr<anurbs::EntryBase>::~shared_ptr((shared_ptr<anurbs::EntryBase> *)&local_a0);
    local_b4 = 0;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_true>
              (&local_b0,(unsigned_long *)(local_60 + 8),&local_b4);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)&key[1].field_2,in_RDX);
    std::pair<unsigned_long,_unsigned_long>::operator=(this_00,&local_b0);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                           *)&stack0xffffffffffffffc8);
    ptVar3 = std::get<0ul,unsigned_long,unsigned_long>(&ppVar2->second);
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::operator[]((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                  *)key,*ptVar3);
    std::static_pointer_cast<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2l>>,anurbs::EntryBase>
              ((shared_ptr<anurbs::EntryBase> *)&local_c8);
    std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::operator=
              ((shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> *)&it,&local_c8);
    std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::~shared_ptr(&local_c8);
  }
  std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::shared_ptr
            (&local_d8,(shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> *)&it);
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::Ref
            ((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)this,&local_d8);
  std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::~shared_ptr(&local_d8);
  std::shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_>::~shared_ptr
            ((shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>_> *)&it);
  RVar4.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar4.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::NurbsSurfaceGeometry<2L>_>)
         RVar4.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ref<TData> get_lazy(std::string key)
    {
        Pointer<Entry<TData>> entry;

        const auto it = m_key_map.find(key);

        if (it == m_key_map.end()) {
            const auto index = m_entries.size();
            entry = Entry<TData>::create(key, nullptr);
            m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));
            m_key_map[key] = { index, 0 };
        } else {
            entry = std::static_pointer_cast<Entry<TData>>(
                m_entries[std::get<0>(it->second)]);
        }

        return Ref<TData>(entry);
    }